

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp.cc
# Opt level: O2

void __thiscall
mp::SPAdapter::GetRealizations(SPAdapter *this,int con_index,CallExpr random,int *arg_index)

{
  uint uVar1;
  uint *puVar2;
  pointer piVar3;
  int *piVar4;
  int iVar5;
  uint *puVar6;
  RandomVector *this_00;
  int iVar7;
  undefined1 auVar8 [12];
  int var_index;
  vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_> *local_58;
  string local_50;
  
  this_00 = (this->rvs_).
            super__Vector_base<mp::SPAdapter::RandomVector,_std::allocator<mp::SPAdapter::RandomVector>_>
            ._M_impl.super__Vector_impl_data._M_start + con_index;
  puVar2 = *(uint **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                            super_ExprBase.impl_ + 0x18 + (long)*arg_index * 8);
  puVar6 = (uint *)0x0;
  if ((*puVar2 & 0xfffffffe) == 2) {
    puVar6 = puVar2;
  }
  uVar1 = puVar6[1];
  local_58 = &this->random_vars_;
  var_index = uVar1;
  local_50._M_string_length._0_4_ = RandomVector::num_elements(this_00);
  local_50._M_dataplus._M_p._0_4_ = uVar1;
  local_50._M_dataplus._M_p._4_4_ = con_index;
  std::vector<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>::
  emplace_back<mp::SPAdapter::RandomVarInfo>(local_58,(RandomVarInfo *)&local_50);
  piVar3 = (this->var_orig2core_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar3[(int)uVar1] == 0) {
    piVar3[(int)uVar1] =
         (int)(((long)(this->random_vars_).
                      super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->random_vars_).
                     super__Vector_base<mp::SPAdapter::RandomVarInfo,_std::allocator<mp::SPAdapter::RandomVarInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / -0xc);
    iVar5 = *arg_index;
    iVar7 = iVar5 + 1;
    while ((*arg_index = iVar7,
           iVar7 < *(int *)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                  super_ExprBase.impl_ + 0x10) &&
           (piVar4 = *(int **)((long)random.super_BasicExpr<(mp::expr::Kind)41,_(mp::expr::Kind)41>.
                                     super_ExprBase.impl_ + 0x18 + (long)iVar7 * 8), *piVar4 == 1)))
    {
      RandomVector::Add(this_00,*(double *)(piVar4 + 2));
      iVar7 = *arg_index + 1;
    }
    iVar7 = iVar7 - (iVar5 + 1);
    iVar5 = (int)((ulong)((long)(this_00->probabilities_).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(this_00->probabilities_).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
    if (iVar5 == 0) {
      RandomVector::set_num_realizations(this_00,iVar7);
    }
    else if (iVar7 != iVar5) {
      auVar8 = __cxa_allocate_exception(0x18);
      (anonymous_namespace)::lcon_name_abi_cxx11_
                (&local_50,(_anonymous_namespace_ *)(ulong)(uint)con_index,auVar8._8_4_);
      Error::Error<std::__cxx11::string>(auVar8._0_8_,(CStringRef)0x15cb5f,&local_50);
      __cxa_throw(auVar8._0_8_,&Error::typeinfo,fmt::SystemError::~SystemError);
    }
    return;
  }
  auVar8 = __cxa_allocate_exception(0x18);
  (anonymous_namespace)::lcon_name_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)(ulong)(uint)con_index,auVar8._8_4_);
  Error::Error<std::__cxx11::string,int>(auVar8._0_8_,(CStringRef)0x15cb2f,&local_50,&var_index);
  __cxa_throw(auVar8._0_8_,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

void SPAdapter::GetRealizations(int con_index, CallExpr random,
                                int &arg_index) {
  // Add a random variable.
  auto &rv = rvs_[con_index];
  auto var = Cast<Reference>(random.arg(arg_index));
  int var_index = var.index();
  random_vars_.push_back(RandomVarInfo(
                           var_index, con_index, rv.num_elements()));
  int &core_var_index = var_orig2core_[var_index];
  if (core_var_index != 0) {
    throw Error("{}: variable {} used in multiple random vectors",
                lcon_name(con_index), var_index);
  }
  // Mark variable as random.
  core_var_index = -static_cast<int>(random_vars_.size());

  // Get realizatons.
  int start_arg_index = ++arg_index;
  for (; ; ++arg_index) {
    if (arg_index >= random.num_args()) break;
    auto constant = Cast<NumericConstant>(random.arg(arg_index));
    if (!constant) break;
    rv.Add(constant.value());
  }
  int num_realizations = arg_index - start_arg_index;
  if (rv.num_realizations() == 0) {
    rv.set_num_realizations(num_realizations);
  } else if (rv.num_realizations() != num_realizations) {
    throw Error("{}: inconsistent number of realizations",
                lcon_name(con_index));
  }
}